

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O0

void crash_and_recover_with_num_keeping_test(void)

{
  fdb_status fVar1;
  sb_decision_t sVar2;
  fdb_status err_code;
  char *pcVar3;
  fdb_kvs_config *kvs_config_00;
  fdb_status s_21;
  fdb_status s_20;
  fdb_status s_19;
  fdb_status s_18;
  fdb_status s_17;
  fdb_status s_16;
  fdb_status s_15;
  fdb_status s_14;
  fdb_status s_13;
  fdb_status s_12;
  fdb_status s_11;
  fdb_status s_10;
  fdb_status s_9;
  fdb_status s_8;
  fdb_status s_7;
  fdb_status s_6;
  fdb_status s_5;
  fdb_status s_4;
  fdb_status s_3;
  fdb_status s_2;
  fdb_status s_1;
  fdb_status s;
  fdb_config fconfig;
  fdb_kvs_config kvs_config;
  sb_decision_t sb_decision;
  fdb_kvs_info kvs_info;
  fdb_file_info file_info;
  fdb_kvs_handle *snap_db;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_status status;
  char bodybuf [512];
  char keybuf [256];
  size_t last_seqno;
  int nheaders;
  int ndocs;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle *in_stack_fffffffffffff898;
  fdb_file_handle *in_stack_fffffffffffff8a0;
  FILE *pFVar4;
  undefined4 in_stack_fffffffffffff8a8;
  undefined4 in_stack_fffffffffffff8ac;
  size_t in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b8;
  undefined4 in_stack_fffffffffffff8bc;
  void *in_stack_fffffffffffff8c0;
  undefined4 in_stack_fffffffffffff8c8;
  undefined4 in_stack_fffffffffffff8cc;
  fdb_file_info *in_stack_fffffffffffff8d0;
  undefined4 in_stack_fffffffffffff8d8;
  undefined4 in_stack_fffffffffffff8dc;
  fdb_seqnum_t in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9cc;
  fdb_kvs_info *in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa08;
  undefined4 in_stack_fffffffffffffa0c;
  fdb_kvs_config *in_stack_fffffffffffffa40;
  char *in_stack_fffffffffffffa48;
  fdb_kvs_handle **in_stack_fffffffffffffa50;
  undefined4 in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa5c;
  undefined4 in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffabc;
  undefined4 in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac4;
  undefined4 in_stack_fffffffffffffac8;
  fdb_status in_stack_fffffffffffffacc;
  fdb_seqnum_t in_stack_fffffffffffffb40;
  fdb_kvs_handle **in_stack_fffffffffffffb48;
  fdb_kvs_handle *in_stack_fffffffffffffb50;
  ulong local_3a8;
  char local_368 [512];
  char local_168 [264];
  int local_60;
  int local_5c;
  int local_58;
  uint local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  local_60 = 10;
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  local_58 = system("rm -rf  staleblktest* > errorlog.txt");
  fdb_open((fdb_file_handle **)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
           (char *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
           (fdb_config *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
  fdb_kvs_open((fdb_file_handle *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
               in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
  for (local_54 = 0; (int)local_54 < local_60 + 1; local_54 = local_54 + 1) {
    sprintf(local_168,"%dkey",(ulong)local_54);
    fillstr(local_368,'b',0x200);
    strlen(local_168);
    strlen(local_368);
    fVar1 = fdb_set_kv((fdb_kvs_handle *)
                       CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                       in_stack_fffffffffffff8d0,
                       CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
                       in_stack_fffffffffffff8c0,
                       CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
    pFVar4 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar3 = fdb_error_msg(fVar1);
      fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x42f);
      crash_and_recover_with_num_keeping_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x42f,"void crash_and_recover_with_num_keeping_test()");
    }
    fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffff898,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pFVar4 = _stderr;
      pcVar3 = fdb_error_msg(fVar1);
      fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x431);
      crash_and_recover_with_num_keeping_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x431,"void crash_and_recover_with_num_keeping_test()");
    }
  }
  local_54 = 0;
  do {
    sprintf(local_168,"0key");
    fillstr(local_368,'c',0x80);
    kvs_config_00 = (fdb_kvs_config *)strlen(local_168);
    pcVar3 = local_368;
    strlen(local_368);
    fVar1 = fdb_set_kv((fdb_kvs_handle *)
                       CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                       in_stack_fffffffffffff8d0,
                       CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
                       in_stack_fffffffffffff8c0,
                       CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
    pFVar4 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar3 = fdb_error_msg(fVar1);
      fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x43b);
      crash_and_recover_with_num_keeping_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x43b,"void crash_and_recover_with_num_keeping_test()");
    }
    local_54 = local_54 + 1;
    fVar1 = fdb_get_file_info((fdb_file_handle *)
                              CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                              in_stack_fffffffffffff8d0);
    pFVar4 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar3 = fdb_error_msg(fVar1);
      fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x43e);
      crash_and_recover_with_num_keeping_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x43e,"void crash_and_recover_with_num_keeping_test()");
    }
  } while (local_3a8 < 0x1000000);
  local_5c = local_54;
  sVar2 = sb_check_block_reusing
                    ((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8)
                    );
  if (sVar2 != SBD_RECLAIM) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x444);
    crash_and_recover_with_num_keeping_test::__test_pass = 0;
    if (sVar2 != SBD_RECLAIM) {
      __assert_fail("sb_decision == SBD_RECLAIM",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x444,"void crash_and_recover_with_num_keeping_test()");
    }
  }
  fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffff898,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pFVar4 = _stderr;
    pcVar3 = fdb_error_msg(fVar1);
    fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x447);
    crash_and_recover_with_num_keeping_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x447,"void crash_and_recover_with_num_keeping_test()");
  }
  fVar1 = fdb_get_kvs_info((fdb_kvs_handle *)
                           CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                           in_stack_fffffffffffffa00);
  pFVar4 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar1);
    fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x449);
    crash_and_recover_with_num_keeping_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x449,"void crash_and_recover_with_num_keeping_test()");
  }
  for (local_54 = 0; (int)local_54 < local_60; local_54 = local_54 + 1) {
    sprintf(local_168,"%dkey",(ulong)local_54);
    fillstr(local_368,'d',0x40);
    strlen(local_168);
    strlen(local_368);
    in_stack_fffffffffffffacc =
         fdb_set_kv((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                    in_stack_fffffffffffff8d0,
                    CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
                    in_stack_fffffffffffff8c0,
                    CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
    if (in_stack_fffffffffffffacc != FDB_RESULT_SUCCESS) {
      pFVar4 = _stderr;
      pcVar3 = fdb_error_msg(in_stack_fffffffffffffacc);
      fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",
              (ulong)(uint)in_stack_fffffffffffffacc,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x452);
      crash_and_recover_with_num_keeping_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x452,"void crash_and_recover_with_num_keeping_test()");
    }
    fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffff898,'\0');
    pFVar4 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar3 = fdb_error_msg(fVar1);
      fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x454);
      crash_and_recover_with_num_keeping_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x454,"void crash_and_recover_with_num_keeping_test()");
    }
    in_stack_fffffffffffffac8 = 0;
  }
  fVar1 = fdb_kvs_close(in_stack_fffffffffffff898);
  pFVar4 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar1);
    fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x459);
    crash_and_recover_with_num_keeping_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x459,"void crash_and_recover_with_num_keeping_test()");
  }
  err_code = fdb_close((fdb_file_handle *)in_stack_fffffffffffff898);
  pFVar4 = _stderr;
  if (err_code != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(err_code);
    fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)err_code,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x45b);
    crash_and_recover_with_num_keeping_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x45b,"void crash_and_recover_with_num_keeping_test()");
  }
  fdb_shutdown();
  fVar1 = fdb_open((fdb_file_handle **)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8)
                   ,(char *)CONCAT44(fVar1,err_code),
                   (fdb_config *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
  pFVar4 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar1);
    fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x460);
    crash_and_recover_with_num_keeping_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x460,"void crash_and_recover_with_num_keeping_test()");
  }
  fdb_kvs_open((fdb_file_handle *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
               in_stack_fffffffffffffa50,pcVar3,kvs_config_00);
  fVar1 = fdb_get_file_info((fdb_file_handle *)
                            CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                            in_stack_fffffffffffff8d0);
  pFVar4 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar1);
    fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x465);
    crash_and_recover_with_num_keeping_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x465,"void crash_and_recover_with_num_keeping_test()");
  }
  local_58 = _disk_dump((char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
                        in_stack_fffffffffffff8b0,
                        CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
  if (local_58 < 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x468);
    crash_and_recover_with_num_keeping_test::__test_pass = 0;
    if (local_58 < 0) {
      __assert_fail("r >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x468,"void crash_and_recover_with_num_keeping_test()");
    }
  }
  fVar1 = fdb_snapshot_open(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                            in_stack_fffffffffffffb40);
  pFVar4 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar1);
    fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x46c);
    crash_and_recover_with_num_keeping_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x46c,"void crash_and_recover_with_num_keeping_test()");
  }
  fVar1 = fdb_rollback((fdb_kvs_handle **)
                       CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                       in_stack_fffffffffffff9c0);
  pFVar4 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar1);
    fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x470);
    crash_and_recover_with_num_keeping_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x470,"void crash_and_recover_with_num_keeping_test()");
  }
  fVar1 = fdb_compact(in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898);
  pFVar4 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar1);
    fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x474);
    crash_and_recover_with_num_keeping_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x474,"void crash_and_recover_with_num_keeping_test()");
  }
  for (local_54 = 0; (int)local_54 < local_60 + 1; local_54 = local_54 + 1) {
    sprintf(local_168,"%dkey",(ulong)local_54);
    strlen(local_168);
    fVar1 = fdb_del_kv((fdb_kvs_handle *)
                       CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
                       in_stack_fffffffffffff8c0,
                       CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
    pFVar4 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar3 = fdb_error_msg(fVar1);
      fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x47a);
      crash_and_recover_with_num_keeping_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x47a,"void crash_and_recover_with_num_keeping_test()");
    }
    fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffff898,'\0');
    pFVar4 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar3 = fdb_error_msg(fVar1);
      fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x47d);
      crash_and_recover_with_num_keeping_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x47d,"void crash_and_recover_with_num_keeping_test()");
    }
  }
  sVar2 = sb_check_block_reusing
                    ((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8)
                    );
  if (sVar2 != SBD_NONE) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x482);
    crash_and_recover_with_num_keeping_test::__test_pass = 0;
    if (sVar2 != SBD_NONE) {
      __assert_fail("sb_decision == SBD_NONE",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x482,"void crash_and_recover_with_num_keeping_test()");
    }
  }
  for (local_54 = 0; (int)local_54 < local_5c; local_54 = local_54 + 1) {
    sprintf(local_168,"0key");
    fillstr(local_368,'e',0x200);
    strlen(local_168);
    strlen(local_368);
    fVar1 = fdb_set_kv((fdb_kvs_handle *)
                       CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                       in_stack_fffffffffffff8d0,
                       CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
                       in_stack_fffffffffffff8c0,
                       CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pFVar4 = _stderr;
      pcVar3 = fdb_error_msg(fVar1);
      fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x48a);
      crash_and_recover_with_num_keeping_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x48a,"void crash_and_recover_with_num_keeping_test()");
    }
  }
  sVar2 = sb_check_block_reusing
                    ((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8)
                    );
  if (sVar2 != SBD_RECLAIM) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x48d);
    crash_and_recover_with_num_keeping_test::__test_pass = 0;
    if (sVar2 != SBD_RECLAIM) {
      __assert_fail("sb_decision == SBD_RECLAIM",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x48d,"void crash_and_recover_with_num_keeping_test()");
    }
  }
  fVar1 = fdb_kvs_close(in_stack_fffffffffffff898);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_kvs_close(in_stack_fffffffffffff898);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pFVar4 = _stderr;
      pcVar3 = fdb_error_msg(fVar1);
      fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x492);
      crash_and_recover_with_num_keeping_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x492,"void crash_and_recover_with_num_keeping_test()");
    }
    fVar1 = fdb_close((fdb_file_handle *)in_stack_fffffffffffff898);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pFVar4 = _stderr;
      pcVar3 = fdb_error_msg(fVar1);
      fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x494);
      crash_and_recover_with_num_keeping_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x494,"void crash_and_recover_with_num_keeping_test()");
    }
    fdb_shutdown();
    memleak_end();
    if (crash_and_recover_with_num_keeping_test::__test_pass == 0) {
      fprintf(_stderr,"%s FAILED\n","crash and recover with num keeping test");
    }
    else {
      fprintf(_stderr,"%s PASSED\n","crash and recover with num keeping test");
    }
    return;
  }
  pFVar4 = _stderr;
  pcVar3 = fdb_error_msg(fVar1);
  fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
          ,0x490);
  crash_and_recover_with_num_keeping_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x490,"void crash_and_recover_with_num_keeping_test()");
}

Assistant:

void crash_and_recover_with_num_keeping_test() {
    TEST_INIT();
    memleak_start();

    int i, r, ndocs;
    int nheaders = 10;
    size_t last_seqno;
    char keybuf[256];
    char bodybuf[512];

    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *snap_db;
    fdb_file_info file_info;
    fdb_kvs_info kvs_info;
    sb_decision_t sb_decision;

    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 65;
    fconfig.num_keeping_headers = nheaders;

    // remove previous staleblktest files
    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    fdb_open(&dbfile, "./staleblktest1file.1", &fconfig);
    fdb_kvs_open(dbfile, &db, "./staleblktest1", &kvs_config);

    // create num_keeping_headers+1
    for (i = 0; i < nheaders + 1; i++) {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'b', 512);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        sprintf(keybuf, "0key");
        fillstr(bodybuf, 'c', 128);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size < SB_MIN_BLOCK_REUSING_FILESIZE);
    ndocs = i;

    // expect block reclaim
    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);
    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_STATUS(status);
    last_seqno = kvs_info.last_seqnum;

    // create num_keeping_headers
    for (i = 0; i < nheaders; i++) {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'd', 64);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // preemptive shutdown
    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    // reopen
    status = fdb_open(&dbfile, "./staleblktest1file.1", &fconfig);
    TEST_STATUS(status);
    fdb_kvs_open(dbfile, &db, "./staleblktest1", &kvs_config);
    TEST_STATUS(status);

    status = fdb_get_file_info(dbfile, &file_info);
    TEST_STATUS(status);
    r = _disk_dump("./staleblktest1file.1", file_info.file_size,
                   (2 * fconfig.blocksize) + (fconfig.blocksize / 4));
    TEST_CHK(r >= 0);

    // snapshot to last keeping header
    status = fdb_snapshot_open(db, &snap_db, last_seqno);
    TEST_STATUS(status);

    // rollback to last keepheader
    status = fdb_rollback(&db, last_seqno);
    TEST_STATUS(status);

    // manual commit
    status = fdb_compact(dbfile, "./staleblktest1file.3");
    TEST_STATUS(status);

    // delete items
    for (i = 0; i < nheaders + 1; i++) {
        sprintf(keybuf, "%dkey",i);
        status = fdb_del_kv(db, keybuf, strlen(keybuf));
        TEST_STATUS(status);
        // commit
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // not reusing blocks
    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_NONE);

    // append until reuse
    for (i = 0; i < ndocs; i++) {
        sprintf(keybuf, "0key");
        fillstr(bodybuf, 'e', 512);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
    }
    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    status = fdb_kvs_close(snap_db);
    TEST_STATUS(status);
    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("crash and recover with num keeping test");
}